

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.h
# Opt level: O3

ostream * operator<<(ostream *os,Employee *employee)

{
  ostream *poVar1;
  
  poVar1 = operator<<(os,&employee->super_Person);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," hourWork: ",0xb);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,employee->hourWork);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," salaryPerHour: ",0x10);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,employee->salaryPerHour);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," workToDo: ",0xb);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,employee->workToDo);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," workDone: ",0xb);
  std::ostream::operator<<((ostream *)poVar1,employee->workDone);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Employee &employee) {
        os << static_cast<const Person &>(employee) << " hourWork: " << employee.hourWork << " salaryPerHour: "
           << employee.salaryPerHour << " workToDo: " << employee.workToDo << " workDone: " << employee.workDone;
        return os;
    }